

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void cursor_pos_callback(GLFWwindow *self,double x,double y)

{
  void *pvVar1;
  double dVar2;
  double dVar3;
  double newY;
  double newX;
  double scale [2];
  bov_window_t *window;
  double y_local;
  double x_local;
  GLFWwindow *self_local;
  
  pvVar1 = glfwGetWindowUserPointer(self);
  if (*(float *)((long)pvVar1 + 0x10) < *(float *)((long)pvVar1 + 0x14) ||
      *(float *)((long)pvVar1 + 0x10) == *(float *)((long)pvVar1 + 0x14)) {
    newX = 1.0;
    scale[0] = (double)(*(float *)((long)pvVar1 + 0x10) / *(float *)((long)pvVar1 + 0x14));
  }
  else {
    newX = (double)(*(float *)((long)pvVar1 + 0x14) / *(float *)((long)pvVar1 + 0x10));
    scale[0] = 1.0;
  }
  dVar2 = ((x * 2.0) / (double)*(int *)((long)pvVar1 + 0x34) - 1.0) /
          (newX * (double)*(float *)((long)pvVar1 + 0x20));
  dVar3 = 1.0 - y / (double)*(int *)((long)pvVar1 + 0x38);
  dVar3 = (dVar3 + dVar3 + -1.0) / (scale[0] * (double)*(float *)((long)pvVar1 + 0x20));
  if ((0.0 < *(double *)((long)pvVar1 + 0x50)) || (0.0 < *(double *)((long)pvVar1 + 0x58))) {
    *(float *)((long)pvVar1 + 0x18) =
         (float)(dVar2 - *(double *)((long)pvVar1 + 0x40)) + *(float *)((long)pvVar1 + 0x18);
    *(float *)((long)pvVar1 + 0x1c) =
         (float)(dVar3 - *(double *)((long)pvVar1 + 0x48)) + *(float *)((long)pvVar1 + 0x1c);
  }
  *(double *)((long)pvVar1 + 0x40) = (double)(float)dVar2;
  *(double *)((long)pvVar1 + 0x48) = (double)(float)dVar3;
  return;
}

Assistant:

static void cursor_pos_callback(GLFWwindow* self, double x, double y)
{
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);

	double scale[2];
	if(window->param.res[0] > window->param.res[1]) {
		scale[0] = window->param.res[1] / window->param.res[0];
		scale[1] = 1.0;
	}
	else {
		scale[0] = 1.0;
		scale[1] = window->param.res[0] / window->param.res[1];
	}
	// TODO: modify this to use the scale
	double newX = (2.0 * x / window->size[0] - 1.0) /
	                (scale[0] * window->param.zoom);
	double newY = (2.0 * (1.0 - y / window->size[1]) - 1.0) /
	                (scale[1] * window->param.zoom);

	if(window->clickTime[0]>0.0 || window->clickTime[1]>0.0) {
		window->param.translate[0] += (GLfloat) (newX - window->cursorPos[0]);
		window->param.translate[1] += (GLfloat) (newY - window->cursorPos[1]);
	}

	window->cursorPos[0] = (GLfloat) newX;
	window->cursorPos[1] = (GLfloat) newY;
}